

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-try-send.c
# Opt level: O3

int run_test_udp_try_send(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_udp_t *puVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_udp_t *puVar5;
  code *pcVar6;
  uv_udp_t *puVar7;
  char *pcVar8;
  undefined1 auVar9 [16];
  sockaddr_in addr;
  undefined1 auStack_28 [16];
  undefined1 local_18 [16];
  
  puVar7 = (uv_udp_t *)auStack_28;
  pcVar8 = "0.0.0.0";
  puVar5 = (uv_udp_t *)0x23a3;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_28);
  if (iVar1 == 0) {
    puVar2 = (uv_udp_t *)uv_default_loop();
    puVar5 = &server;
    iVar1 = uv_udp_init();
    if (iVar1 != 0) goto LAB_0018bcbf;
    puVar2 = &server;
    iVar1 = uv_udp_bind(&server,auStack_28,0);
    if (iVar1 != 0) goto LAB_0018bcc4;
    puVar2 = &server;
    pcVar6 = alloc_cb;
    iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
    puVar7 = (uv_udp_t *)pcVar6;
    if (iVar1 != 0) goto LAB_0018bcc9;
    puVar2 = (uv_udp_t *)0x1a4e6a;
    puVar7 = (uv_udp_t *)0x23a3;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_28);
    if (iVar1 != 0) goto LAB_0018bcce;
    puVar2 = (uv_udp_t *)uv_default_loop();
    puVar7 = &client;
    iVar1 = uv_udp_init();
    if (iVar1 != 0) goto LAB_0018bcd3;
    local_18 = uv_buf_init(run_test_udp_try_send::buffer,0x10000);
    puVar7 = (uv_udp_t *)local_18;
    puVar2 = &client;
    iVar1 = uv_udp_try_send(&client,puVar7,1,auStack_28);
    if (iVar1 != -0x5a) goto LAB_0018bcd8;
    auVar9 = uv_buf_init("EXIT",4);
    puVar7 = (uv_udp_t *)local_18;
    puVar2 = &client;
    local_18 = auVar9;
    iVar1 = uv_udp_try_send(&client,puVar7,1,auStack_28);
    if (iVar1 != 4) goto LAB_0018bcdd;
    puVar2 = (uv_udp_t *)uv_default_loop();
    puVar7 = (uv_udp_t *)0x0;
    uv_run();
    if (close_cb_called != 2) goto LAB_0018bce2;
    if (sv_recv_cb_called != 1) goto LAB_0018bce7;
    if (client.send_queue_size != 0) goto LAB_0018bcec;
    if (server.send_queue_size != 0) goto LAB_0018bcf1;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    puVar7 = (uv_udp_t *)0x0;
    uv_run(uVar3);
    puVar2 = (uv_udp_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_udp_try_send_cold_1();
    puVar2 = (uv_udp_t *)pcVar8;
LAB_0018bcbf:
    puVar7 = puVar5;
    run_test_udp_try_send_cold_2();
LAB_0018bcc4:
    run_test_udp_try_send_cold_3();
LAB_0018bcc9:
    run_test_udp_try_send_cold_4();
LAB_0018bcce:
    run_test_udp_try_send_cold_5();
LAB_0018bcd3:
    run_test_udp_try_send_cold_6();
LAB_0018bcd8:
    run_test_udp_try_send_cold_7();
LAB_0018bcdd:
    run_test_udp_try_send_cold_8();
LAB_0018bce2:
    run_test_udp_try_send_cold_9();
LAB_0018bce7:
    run_test_udp_try_send_cold_10();
LAB_0018bcec:
    run_test_udp_try_send_cold_11();
LAB_0018bcf1:
    run_test_udp_try_send_cold_12();
  }
  run_test_udp_try_send_cold_13();
  lVar4 = CONCAT71(0x5d13,puVar2 == &client || puVar2 == &server);
  if (puVar2 == &client || puVar2 == &server) {
    if (puVar7 < (uv_udp_t *)0x10001) {
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x10000;
      return extraout_EAX;
    }
  }
  else {
    alloc_cb_cold_1();
  }
  alloc_cb_cold_2();
  if ((long)puVar7 < 1) {
    sv_recv_cb_cold_1();
LAB_0018bd88:
    sv_recv_cb_cold_2();
  }
  else {
    if (puVar7 != (uv_udp_t *)0x4) goto LAB_0018bd88;
    if (lVar4 != 0) {
      if (*(int *)*extraout_RDX_00 == 0x54495845) {
        uv_close();
        iVar1 = uv_close(&client,close_cb);
        sv_recv_cb_called = sv_recv_cb_called + 1;
        return iVar1;
      }
      goto LAB_0018bd92;
    }
  }
  sv_recv_cb_cold_4();
LAB_0018bd92:
  sv_recv_cb_cold_3();
  if (puVar2 == &client || puVar2 == &server) {
    iVar1 = uv_is_closing();
    if (iVar1 != 0) {
      close_cb_called = close_cb_called + 1;
      return extraout_EAX_00;
    }
  }
  else {
    close_cb_cold_1();
  }
  close_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar2,0);
  return iVar1;
}

Assistant:

TEST_IMPL(udp_try_send) {
  struct sockaddr_in addr;
  static char buffer[64 * 1024];
  uv_buf_t buf;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  buf = uv_buf_init(buffer, sizeof(buffer));
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &addr);
  ASSERT(r == UV_EMSGSIZE);

  buf = uv_buf_init("EXIT", 4);
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &addr);
  ASSERT(r == 4);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);
  ASSERT(sv_recv_cb_called == 1);

  ASSERT(client.send_queue_size == 0);
  ASSERT(server.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}